

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O3

void __thiscall
toml::
result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
::
result<std::pair<toml::offset_datetime,toml::detail::region<std::vector<char,std::allocator<char>>>>,std::__cxx11::string>
          (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
           *this,result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
  *prVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
  rVar3;
  pointer pcVar4;
  undefined8 uVar5;
  
  rVar3 = (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
           )other->is_ok_;
  *this = rVar3;
  if (rVar3 == (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
                )0x1) {
    success<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>::
    success<std::pair<toml::offset_datetime,toml::detail::region<std::vector<char,std::allocator<char>>>>>
              ((success<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>> *)
               (this + 8),&(other->field_1).succ.value);
    return;
  }
  prVar1 = this + 0x18;
  *(result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
    **)(this + 8) = prVar1;
  pcVar4 = (other->field_1).fail.value._M_dataplus._M_p;
  paVar2 = &(other->field_1).fail.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(other->field_1).fail.value.field_2 + 8);
    *(size_type *)prVar1 = paVar2->_M_allocated_capacity;
    *(undefined8 *)(this + 0x20) = uVar5;
  }
  else {
    *(pointer *)(this + 8) = pcVar4;
    *(size_type *)prVar1 = paVar2->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x10) = (other->field_1).fail.value._M_string_length;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&other->field_1 = paVar2;
  (other->field_1).fail.value._M_string_length = 0;
  *(undefined1 *)((long)&other->field_1 + 0x10) = 0;
  return;
}

Assistant:

bool is_ok()  const noexcept {return is_ok_;}